

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::FindFileContainingExtension
          (EncodedDescriptorDatabase *this,StringViewArg containing_type,int field_number,
          FileDescriptorProto *output)

{
  bool bVar1;
  MessageLite *to;
  string_view containing_type_00;
  string_view from;
  pair<const_void_*,_int> pVar2;
  
  to = (MessageLite *)(ulong)(uint)field_number;
  containing_type_00._M_str = (containing_type->_M_dataplus)._M_p;
  containing_type_00._M_len = containing_type->_M_string_length;
  pVar2 = DescriptorIndex::FindExtension
                    ((this->index_)._M_t.
                     super___uniq_ptr_impl<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex,_std::default_delete<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex_*,_std::default_delete<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex>_>
                     .
                     super__Head_base<0UL,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex_*,_false>
                     ._M_head_impl,containing_type_00,field_number);
  if (pVar2.first != (void *)0x0) {
    from._M_str = (char *)output;
    from._M_len = (size_t)pVar2.first;
    bVar1 = internal::ParseNoReflection((internal *)(long)pVar2.second,from,to);
    return bVar1;
  }
  return false;
}

Assistant:

bool EncodedDescriptorDatabase::FindFileContainingExtension(
    StringViewArg containing_type, int field_number,
    FileDescriptorProto* PROTOBUF_NONNULL output) {
  return MaybeParse(index_->FindExtension(containing_type, field_number),
                    output);
}